

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlEnumerationPtr xmlParseNotationType(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *name;
  xmlEnumerationPtr pxVar3;
  _xmlEnumeration *p_Var4;
  xmlEnumerationPtr pxVar5;
  xmlEnumerationPtr cur;
  xmlEnumerationPtr pxVar6;
  
  if (*ctxt->input->cur == '(') {
    pxVar5 = (xmlEnumerationPtr)0x0;
    cur = (xmlEnumerationPtr)0x0;
    do {
      xmlNextChar(ctxt);
      xmlSkipBlankCharsPE(ctxt);
      name = xmlParseName(ctxt);
      p_Var4 = cur;
      if (name == (xmlChar *)0x0) {
        xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"Name expected in NOTATION declaration\n");
        goto LAB_001347bd;
      }
      for (; pxVar6 = cur, p_Var4 != (xmlEnumerationPtr)0x0; p_Var4 = p_Var4->next) {
        iVar2 = xmlStrEqual(name,p_Var4->name);
        if (iVar2 != 0) {
          xmlValidityError(ctxt,XML_DTD_DUP_TOKEN,
                           "standalone: attribute notation value token %s duplicated\n",name,
                           (xmlChar *)0x0);
          iVar2 = xmlDictOwns(ctxt->dict,name);
          pxVar3 = pxVar5;
          if (iVar2 == 0) {
            (*xmlFree)(name);
          }
          goto LAB_00134755;
        }
      }
      pxVar3 = xmlCreateEnumeration(name);
      if (pxVar3 == (xmlEnumerationPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
        goto LAB_001347bd;
      }
      pxVar6 = pxVar3;
      if (pxVar5 != (xmlEnumerationPtr)0x0) {
        pxVar5->next = pxVar3;
        pxVar6 = cur;
      }
LAB_00134755:
      xmlSkipBlankCharsPE(ctxt);
      xVar1 = *ctxt->input->cur;
      pxVar5 = pxVar3;
      cur = pxVar6;
    } while (xVar1 == '|');
    if (xVar1 == ')') {
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
LAB_001347bd:
      xmlFreeEnumeration(cur);
      pxVar6 = (xmlEnumerationPtr)0x0;
    }
  }
  else {
    pxVar6 = (xmlEnumerationPtr)0x0;
    xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
  }
  return pxVar6;
}

Assistant:

xmlEnumerationPtr
xmlParseNotationType(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlEnumerationPtr ret = NULL, last = NULL, cur, tmp;

    if (RAW != '(') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	return(NULL);
    }
    do {
        NEXT;
	SKIP_BLANKS_PE;
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "Name expected in NOTATION declaration\n");
            xmlFreeEnumeration(ret);
	    return(NULL);
	}
	tmp = ret;
	while (tmp != NULL) {
	    if (xmlStrEqual(name, tmp->name)) {
		xmlValidityError(ctxt, XML_DTD_DUP_TOKEN,
	  "standalone: attribute notation value token %s duplicated\n",
				 name, NULL);
		if (!xmlDictOwns(ctxt->dict, name))
		    xmlFree((xmlChar *) name);
		break;
	    }
	    tmp = tmp->next;
	}
	if (tmp == NULL) {
	    cur = xmlCreateEnumeration(name);
	    if (cur == NULL) {
                xmlErrMemory(ctxt);
                xmlFreeEnumeration(ret);
                return(NULL);
            }
	    if (last == NULL) ret = last = cur;
	    else {
		last->next = cur;
		last = cur;
	    }
	}
	SKIP_BLANKS_PE;
    } while (RAW == '|');
    if (RAW != ')') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
        xmlFreeEnumeration(ret);
	return(NULL);
    }
    NEXT;
    return(ret);
}